

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::draw_text_c1(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uchar *resized_font_bitmap;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uchar *puVar12;
  uchar *puVar13;
  long lVar14;
  ulong uVar15;
  
  iVar4 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar4 * fontpixelsize));
  sVar7 = strlen(text);
  if (0 < (int)(uint)sVar7) {
    uVar15 = 0;
    uVar9 = x;
    do {
      cVar1 = text[uVar15];
      if (cVar1 == ' ') {
        uVar6 = uVar9 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + iVar4;
        uVar6 = x;
      }
      else {
        iVar5 = isprint((int)cVar1);
        uVar6 = uVar9;
        if (iVar5 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5a74c0),resized_font_bitmap,fontpixelsize);
          uVar10 = 0;
          if (0 < y) {
            uVar10 = y;
          }
          uVar2 = y + iVar4;
          if (h <= y + iVar4) {
            uVar2 = h;
          }
          uVar8 = 0;
          if (0 < (int)uVar9) {
            uVar8 = uVar9;
          }
          uVar6 = uVar9 + fontpixelsize;
          uVar3 = w;
          if ((int)uVar6 < w) {
            uVar3 = uVar6;
          }
          if ((int)uVar10 < (int)uVar2) {
            uVar11 = (ulong)uVar10;
            puVar12 = pixels + (long)stride * uVar11 + (ulong)uVar8;
            puVar13 = resized_font_bitmap +
                      (((uVar11 - (long)y) * (long)fontpixelsize + (ulong)uVar8) - (long)(int)uVar9)
            ;
            do {
              if ((int)uVar8 < (int)uVar3) {
                lVar14 = 0;
                do {
                  puVar12[lVar14] =
                       (uchar)((ulong)((puVar13[lVar14] ^ 0xff) * (uint)puVar12[lVar14] +
                                      (color & 0xff) * (uint)puVar13[lVar14]) * 0x1010102 >> 0x20);
                  lVar14 = lVar14 + 1;
                } while (uVar3 - uVar8 != (int)lVar14);
              }
              uVar11 = uVar11 + 1;
              puVar12 = puVar12 + stride;
              puVar13 = puVar13 + fontpixelsize;
            } while (uVar11 != uVar2);
          }
        }
      }
      uVar9 = uVar6;
      uVar15 = uVar15 + 1;
    } while (uVar15 != ((uint)sVar7 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c1(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p += 1;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}